

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O1

bool __thiscall
cmdline::parser::
option_with_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::set(option_with_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      *this,string *value)

{
  long *local_30 [2];
  long local_20 [2];
  
  (*(this->super_option_base)._vptr_option_base[0xc])(local_30,this,value);
  std::__cxx11::string::operator=((string *)&this->actual,(string *)local_30);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  this->has = true;
  return true;
}

Assistant:

bool set(const std::string &value){
                        try
                        {
                            actual = read(value);
                            has = true;
                        }
                        catch(
                        const std::exception
                        &e){
                            return false;
                        }
                        return true;
                    }